

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialPivLU.h
# Opt level: O0

void Eigen::internal::
     partial_lu_inplace<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpositions<_1,_1,int>>
               (Matrix<double,__1,__1,_0,__1,__1> *lu,
               Transpositions<_1,__1,_int> *row_transpositions,Index *nb_transpositions)

{
  Index IVar1;
  Index IVar2;
  Index *pIVar3;
  Index *pIVar4;
  Index cols;
  Scalar *lu_data;
  Index luStride;
  Index *nb_transpositions_local;
  Transpositions<_1,__1,_int> *row_transpositions_local;
  Matrix<double,__1,__1,_0,__1,__1> *lu_local;
  
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    (&lu->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  IVar1 = TranspositionsBase<Eigen::Transpositions<-1,_-1,_int>_>::size
                    ((TranspositionsBase<Eigen::Transpositions<_1,__1,_int>_> *)row_transpositions);
  if (IVar2 != IVar1) {
    __assert_fail("lu.cols() == row_transpositions.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Extended-Kalman-Filter-Project/src/Eigen/src/LU/PartialPivLU.h"
                  ,0x17e,
                  "void Eigen::internal::partial_lu_inplace(MatrixType &, TranspositionType &, typename TranspositionType::Index &) [MatrixType = Eigen::Matrix<double, -1, -1>, TranspositionType = Eigen::Transpositions<-1, -1>]"
                 );
  }
  pIVar3 = TranspositionsBase<Eigen::Transpositions<-1,_-1,_int>_>::coeffRef
                     ((TranspositionsBase<Eigen::Transpositions<_1,__1,_int>_> *)row_transpositions,
                      1);
  pIVar4 = TranspositionsBase<Eigen::Transpositions<-1,_-1,_int>_>::coeffRef
                     ((TranspositionsBase<Eigen::Transpositions<_1,__1,_int>_> *)row_transpositions,
                      0);
  if ((long)pIVar3 - (long)pIVar4 >> 2 == 1) {
    IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      (&lu->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    cols = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                     (&lu->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    lu_data = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeffRef
                        (&lu->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,0,0);
    luStride = Matrix<double,_-1,_-1,_0,_-1,_-1>::outerStride(lu);
    pIVar3 = TranspositionsBase<Eigen::Transpositions<-1,_-1,_int>_>::coeffRef
                       ((TranspositionsBase<Eigen::Transpositions<_1,__1,_int>_> *)
                        row_transpositions,0);
    partial_lu_impl<double,_0,_int>::blocked_lu
              (IVar2,cols,lu_data,luStride,pIVar3,nb_transpositions,0x100);
    return;
  }
  __assert_fail("(&row_transpositions.coeffRef(1)-&row_transpositions.coeffRef(0)) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Extended-Kalman-Filter-Project/src/Eigen/src/LU/PartialPivLU.h"
                ,0x17f,
                "void Eigen::internal::partial_lu_inplace(MatrixType &, TranspositionType &, typename TranspositionType::Index &) [MatrixType = Eigen::Matrix<double, -1, -1>, TranspositionType = Eigen::Transpositions<-1, -1>]"
               );
}

Assistant:

void partial_lu_inplace(MatrixType& lu, TranspositionType& row_transpositions, typename TranspositionType::Index& nb_transpositions)
{
  eigen_assert(lu.cols() == row_transpositions.size());
  eigen_assert((&row_transpositions.coeffRef(1)-&row_transpositions.coeffRef(0)) == 1);

  partial_lu_impl
    <typename MatrixType::Scalar, MatrixType::Flags&RowMajorBit?RowMajor:ColMajor, typename TranspositionType::Index>
    ::blocked_lu(lu.rows(), lu.cols(), &lu.coeffRef(0,0), lu.outerStride(), &row_transpositions.coeffRef(0), nb_transpositions);
}